

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O0

void __thiscall QFont::setCapitalization(QFont *this,Capitalization caps)

{
  Capitalization CVar1;
  QFontPrivate *pQVar2;
  Capitalization in_ESI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  if (((*(uint *)(in_RDI + 8) & 0x1000) == 0) ||
     (CVar1 = capitalization((QFont *)0x712ce2), CVar1 != in_ESI)) {
    QFontPrivate::detachButKeepEngineData
              ((QFont *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    pQVar2 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QFontPrivate> *)0x712d06);
    pQVar2->field_0x7c = pQVar2->field_0x7c & 0x8f | ((byte)in_ESI & 7) << 4;
    *(uint *)(in_RDI + 8) = *(uint *)(in_RDI + 8) | 0x1000;
  }
  return;
}

Assistant:

void QFont::setCapitalization(Capitalization caps)
{
    if ((resolve_mask & QFont::CapitalizationResolved) &&
        capitalization() == caps)
        return;

    QFontPrivate::detachButKeepEngineData(this);

    d->capital = caps;
    resolve_mask |= QFont::CapitalizationResolved;
}